

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  cmStateSnapshot *this_00;
  cmOutputConverter *this_01;
  cmMakefile *pcVar1;
  cmLocalGenerator *pcVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  char *pcVar6;
  _Alloc_hider _Var7;
  pointer ppcVar8;
  allocator local_369;
  cmLocalGenerator *local_368;
  cmStateDirectory local_360;
  string outP;
  string parentBinDir;
  _Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_2f0;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string local_298;
  cmGeneratedFileStream fout;
  
  pcVar1 = this->Makefile;
  local_368 = this;
  std::__cxx11::string::string((string *)&fout,"CMAKE_TESTING_ENABLED",(allocator *)&local_360);
  bVar3 = cmMakefile::IsOn(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  pcVar2 = local_368;
  if (!bVar3) {
    return;
  }
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_298,local_368->Makefile,&configurationTypes,false);
  this_00 = &pcVar2->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&fout,this_00);
  pcVar4 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)&fout);
  std::__cxx11::string::string((string *)&file,pcVar4,(allocator *)&local_360);
  std::__cxx11::string::append((char *)&file);
  std::__cxx11::string::append((char *)&file);
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,file._M_dataplus._M_p,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
  poVar5 = std::operator<<((ostream *)&fout,"# CMake generated Testfile for ");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"# Source directory: ");
  cmStateSnapshot::GetDirectory(&local_360,this_00);
  pcVar4 = cmStateDirectory::GetCurrentSource(&local_360);
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"# Build directory: ");
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&parentBinDir,this_00);
  pcVar4 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)&parentBinDir);
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"# ");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"# This file includes the relevant testing commands ");
  poVar5 = std::operator<<(poVar5,"required for ");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"# testing this directory and lists subdirectories to ");
  poVar5 = std::operator<<(poVar5,"be tested as well.");
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar1 = local_368->Makefile;
  std::__cxx11::string::string((string *)&local_360,"TEST_INCLUDE_FILE",(allocator *)&parentBinDir);
  pcVar4 = cmMakefile::GetProperty(pcVar1,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  if (pcVar4 != (char *)0x0) {
    poVar5 = std::operator<<((ostream *)&fout,"include(\"");
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,"\")");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  pcVar1 = local_368->Makefile;
  std::__cxx11::string::string((string *)&local_360,"TEST_INCLUDE_FILES",(allocator *)&parentBinDir)
  ;
  pcVar4 = cmMakefile::GetProperty(pcVar1,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  if (pcVar4 != (char *)0x0) {
    parentBinDir._M_dataplus._M_p = (pointer)0x0;
    parentBinDir._M_string_length = 0;
    parentBinDir.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)&local_360,pcVar4,(allocator *)&outP);
    cmSystemTools::ExpandListArgument
              ((string *)&local_360,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parentBinDir,false);
    std::__cxx11::string::~string((string *)&local_360);
    for (_Var7 = parentBinDir._M_dataplus; _Var7._M_p != (pointer)parentBinDir._M_string_length;
        _Var7._M_p = _Var7._M_p + 0x20) {
      poVar5 = std::operator<<((ostream *)&fout,"include(\"");
      poVar5 = std::operator<<(poVar5,(string *)_Var7._M_p);
      poVar5 = std::operator<<(poVar5,"\")");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&parentBinDir);
  }
  pcVar1 = local_368->Makefile;
  for (ppcVar8 = (pcVar1->TestGenerators).
                 super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar8 !=
      (pcVar1->TestGenerators).
      super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar8 = ppcVar8 + 1) {
    cmTestGenerator::Compute(*ppcVar8,local_368);
    cmScriptGenerator::Generate
              (&(*ppcVar8)->super_cmScriptGenerator,(ostream *)&fout,&local_298,&configurationTypes)
    ;
  }
  cmMakefile::GetStateSnapshot(local_368->Makefile);
  cmStateSnapshot::GetChildren
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_2f0,
             (cmStateSnapshot *)&local_360);
  pcVar4 = GetCurrentBinaryDirectory(local_368);
  std::__cxx11::string::string((string *)&parentBinDir,pcVar4,(allocator *)&local_360);
  this_01 = &local_368->super_cmOutputConverter;
  for (; local_2f0._M_impl.super__Vector_impl_data._M_start !=
         local_2f0._M_impl.super__Vector_impl_data._M_finish;
      local_2f0._M_impl.super__Vector_impl_data._M_start =
           local_2f0._M_impl.super__Vector_impl_data._M_start + 1) {
    cmStateSnapshot::GetDirectory(&local_360,local_2f0._M_impl.super__Vector_impl_data._M_start);
    pcVar4 = cmStateDirectory::GetCurrentBinary(&local_360);
    std::__cxx11::string::string((string *)&outP,pcVar4,&local_369);
    cmOutputConverter::ConvertToRelativePath((string *)&local_360,this_01,&parentBinDir,&outP);
    std::__cxx11::string::operator=((string *)&outP,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    cmOutputConverter::EscapeForCMake((string *)&local_360,&outP);
    std::__cxx11::string::operator=((string *)&outP,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    poVar5 = std::operator<<((ostream *)&fout,"subdirs(");
    poVar5 = std::operator<<(poVar5,(string *)&outP);
    poVar5 = std::operator<<(poVar5,")");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&outP);
  }
  pcVar1 = local_368->Makefile;
  std::__cxx11::string::string((string *)&local_360,"CMAKE_DIRECTORY_LABELS",(allocator *)&outP);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  pcVar1 = local_368->Makefile;
  std::__cxx11::string::string((string *)&local_360,"LABELS",(allocator *)&outP);
  pcVar6 = cmMakefile::GetProperty(pcVar1,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  if (pcVar4 == (char *)0x0 && pcVar6 == (char *)0x0) goto LAB_002de949;
  std::operator<<((ostream *)&fout,"set_directory_properties(PROPERTIES LABELS ");
  if (pcVar6 == (char *)0x0) {
    if (pcVar4 != (char *)0x0) goto LAB_002de8e6;
  }
  else {
    std::__cxx11::string::string((string *)&outP,pcVar6,&local_369);
    cmOutputConverter::EscapeForCMake((string *)&local_360,&outP);
    std::operator<<((ostream *)&fout,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&outP);
    if (pcVar4 != (char *)0x0) {
      std::operator<<((ostream *)&fout,";");
LAB_002de8e6:
      std::__cxx11::string::string((string *)&outP,pcVar4,&local_369);
      cmOutputConverter::EscapeForCMake((string *)&local_360,&outP);
      std::operator<<((ostream *)&fout,(string *)&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&outP);
    }
  }
  poVar5 = std::operator<<((ostream *)&fout,")");
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_002de949:
  std::__cxx11::string::~string((string *)&parentBinDir);
  std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base(&local_2f0);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurationTypes);
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource() << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary() << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
  }

  const char* testIncludeFiles =
    this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    std::vector<std::string> includesList;
    cmSystemTools::ExpandListArgument(testIncludeFiles, includesList);
    for (std::vector<std::string>::const_iterator i = includesList.begin();
         i != includesList.end(); ++i) {
      fout << "include(\"" << *i << "\")" << std::endl;
    }
  }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const& testers =
    this->Makefile->GetTestGenerators();
  for (std::vector<cmTestGenerator*>::const_iterator gi = testers.begin();
       gi != testers.end(); ++gi) {
    (*gi)->Compute(this);
    (*gi)->Generate(fout, config, configurationTypes);
  }
  typedef std::vector<cmStateSnapshot> vec_t;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  std::string parentBinDir = this->GetCurrentBinaryDirectory();
  for (vec_t::const_iterator i = children.begin(); i != children.end(); ++i) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i->GetDirectory().GetCurrentBinary();
    outP = this->ConvertToRelativePath(parentBinDir, outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")" << std::endl;
  }

  // Add directory labels property
  const char* directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  const char* labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(directoryLabels);
    }
    fout << ")" << std::endl;
  }
}